

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picture_enc.c
# Opt level: O3

int WebPPictureInitInternal(WebPPicture *picture,int version)

{
  int iVar1;
  
  iVar1 = 0;
  if (((version & 0xffffff00U) == 0x200) && (iVar1 = 1, picture != (WebPPicture *)0x0)) {
    memset(picture,0,0x100);
    picture->writer = DummyWriter;
    WebPEncodingSetError(picture,VP8_ENC_OK);
  }
  return iVar1;
}

Assistant:

int WebPPictureInitInternal(WebPPicture* picture, int version) {
  if (WEBP_ABI_IS_INCOMPATIBLE(version, WEBP_ENCODER_ABI_VERSION)) {
    return 0;   // caller/system version mismatch!
  }
  if (picture != NULL) {
    memset(picture, 0, sizeof(*picture));
    picture->writer = DummyWriter;
    WebPEncodingSetError(picture, VP8_ENC_OK);
  }
  return 1;
}